

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_block * cram_read_block(cram_fd *fd)

{
  int iVar1;
  undefined4 uVar2;
  char *pcVar3;
  ssize_t sVar4;
  byte *pbVar5;
  long lVar6;
  char *local_e8;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint32_t crc;
  uchar *cp;
  uchar dat [100];
  cram_block *b;
  cram_fd *fd_local;
  
  register0x00000000 = (cram_fd *)malloc(0x40);
  if (register0x00000000 == (cram_fd *)0x0) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    iVar1 = hgetc(fd->fp);
    *(int *)&stack0xffffffffffffffe0->fp = iVar1;
    if (iVar1 == -1) {
      free(stack0xffffffffffffffe0);
      fd_local = (cram_fd *)0x0;
    }
    else {
      iVar1 = hgetc(fd->fp);
      stack0xffffffffffffffe0->mode = iVar1;
      if (iVar1 == -1) {
        free(stack0xffffffffffffffe0);
        fd_local = (cram_fd *)0x0;
      }
      else {
        iVar1 = itf8_decode(fd,&stack0xffffffffffffffe0->version);
        if (iVar1 == -1) {
          free(stack0xffffffffffffffe0);
          fd_local = (cram_fd *)0x0;
        }
        else {
          iVar1 = itf8_decode(fd,(int32_t *)&stack0xffffffffffffffe0->file_def);
          if (iVar1 == -1) {
            free(stack0xffffffffffffffe0);
            fd_local = (cram_fd *)0x0;
          }
          else {
            iVar1 = itf8_decode(fd,(int32_t *)((long)&stack0xffffffffffffffe0->file_def + 4));
            if (iVar1 == -1) {
              free(stack0xffffffffffffffe0);
              fd_local = (cram_fd *)0x0;
            }
            else {
              if (*(int *)&stack0xffffffffffffffe0->fp == 0) {
                stack0xffffffffffffffe0->record_counter =
                     (long)*(int *)((long)&stack0xffffffffffffffe0->file_def + 4);
                pcVar3 = (char *)malloc((long)*(int *)((long)&stack0xffffffffffffffe0->file_def + 4)
                                       );
                stack0xffffffffffffffe0->prefix = pcVar3;
                if (pcVar3 == (char *)0x0) {
                  free(stack0xffffffffffffffe0);
                  return (cram_block *)0x0;
                }
                iVar1 = *(int *)((long)&stack0xffffffffffffffe0->file_def + 4);
                sVar4 = hread(fd->fp,stack0xffffffffffffffe0->prefix,
                              (long)*(int *)((long)&stack0xffffffffffffffe0->file_def + 4));
                if (iVar1 != sVar4) {
                  free(stack0xffffffffffffffe0->prefix);
                  free(stack0xffffffffffffffe0);
                  return (cram_block *)0x0;
                }
              }
              else {
                stack0xffffffffffffffe0->record_counter =
                     (long)*(int *)&stack0xffffffffffffffe0->file_def;
                pcVar3 = (char *)malloc((long)*(int *)&stack0xffffffffffffffe0->file_def);
                stack0xffffffffffffffe0->prefix = pcVar3;
                if (pcVar3 == (char *)0x0) {
                  free(stack0xffffffffffffffe0);
                  return (cram_block *)0x0;
                }
                iVar1 = *(int *)&stack0xffffffffffffffe0->file_def;
                sVar4 = hread(fd->fp,stack0xffffffffffffffe0->prefix,
                              (long)*(int *)&stack0xffffffffffffffe0->file_def);
                if (iVar1 != sVar4) {
                  free(stack0xffffffffffffffe0->prefix);
                  free(stack0xffffffffffffffe0);
                  return (cram_block *)0x0;
                }
              }
              if (2 < fd->version >> 8) {
                iVar1 = int32_decode(fd,(int32_t *)&stack0xffffffffffffffe0->header);
                if (iVar1 == -1) {
                  free(stack0xffffffffffffffe0);
                  return (cram_block *)0x0;
                }
                cp._0_1_ = (undefined1)*(undefined4 *)&stack0xffffffffffffffe0->fp;
                cp._1_1_ = (undefined1)stack0xffffffffffffffe0->mode;
                if ((stack0xffffffffffffffe0->version & 0xffffff80U) == 0) {
                  cp._2_1_ = (byte)stack0xffffffffffffffe0->version;
                  local_ac = 1;
                }
                else {
                  if ((stack0xffffffffffffffe0->version & 0xffffc000U) == 0) {
                    cp._2_1_ = (byte)((uint)stack0xffffffffffffffe0->version >> 8) | 0x80;
                    cp._3_1_ = (undefined1)stack0xffffffffffffffe0->version;
                    local_b0 = 2;
                  }
                  else {
                    if ((stack0xffffffffffffffe0->version & 0xffe00000U) == 0) {
                      cp._2_1_ = (byte)((uint)stack0xffffffffffffffe0->version >> 0x10) | 0xc0;
                      cp._3_1_ = (undefined1)((uint)stack0xffffffffffffffe0->version >> 8);
                      cp._4_1_ = (undefined1)stack0xffffffffffffffe0->version;
                      local_b4 = 3;
                    }
                    else {
                      if ((stack0xffffffffffffffe0->version & 0xf0000000U) == 0) {
                        cp._2_1_ = (byte)((uint)stack0xffffffffffffffe0->version >> 0x18) | 0xe0;
                        cp._3_1_ = (undefined1)((uint)stack0xffffffffffffffe0->version >> 0x10);
                        cp._4_1_ = (undefined1)((uint)stack0xffffffffffffffe0->version >> 8);
                        cp._5_1_ = (undefined1)stack0xffffffffffffffe0->version;
                        local_b8 = 4;
                      }
                      else {
                        cp._2_1_ = (byte)(stack0xffffffffffffffe0->version >> 0x1c) | 0xf0;
                        cp._3_1_ = (undefined1)(stack0xffffffffffffffe0->version >> 0x14);
                        cp._4_1_ = (undefined1)(stack0xffffffffffffffe0->version >> 0xc);
                        cp._5_1_ = (undefined1)(stack0xffffffffffffffe0->version >> 4);
                        cp._6_1_ = (byte)stack0xffffffffffffffe0->version & 0xf;
                        local_b8 = 5;
                      }
                      local_b4 = local_b8;
                    }
                    local_b0 = local_b4;
                  }
                  local_ac = local_b0;
                }
                lVar6 = (long)local_ac;
                pbVar5 = dat + lVar6 + -6;
                if (((ulong)stack0xffffffffffffffe0->file_def & 0xffffff80) == 0) {
                  *pbVar5 = (byte)*(undefined4 *)&stack0xffffffffffffffe0->file_def;
                  local_bc = 1;
                }
                else {
                  if (((ulong)stack0xffffffffffffffe0->file_def & 0xffffc000) == 0) {
                    *pbVar5 = (byte)((uint)*(undefined4 *)&stack0xffffffffffffffe0->file_def >> 8) |
                              0x80;
                    dat[lVar6 + -5] = (uchar)*(undefined4 *)&stack0xffffffffffffffe0->file_def;
                    local_c0 = 2;
                  }
                  else {
                    if (((ulong)stack0xffffffffffffffe0->file_def & 0xffe00000) == 0) {
                      *pbVar5 = (byte)((uint)*(undefined4 *)&stack0xffffffffffffffe0->file_def >>
                                      0x10) | 0xc0;
                      dat[lVar6 + -5] =
                           (uchar)((uint)*(undefined4 *)&stack0xffffffffffffffe0->file_def >> 8);
                      dat[lVar6 + -4] = (uchar)*(undefined4 *)&stack0xffffffffffffffe0->file_def;
                      local_c4 = 3;
                    }
                    else {
                      if (((ulong)stack0xffffffffffffffe0->file_def & 0xf0000000) == 0) {
                        *pbVar5 = (byte)((uint)*(undefined4 *)&stack0xffffffffffffffe0->file_def >>
                                        0x18) | 0xe0;
                        dat[lVar6 + -5] =
                             (uchar)((uint)*(undefined4 *)&stack0xffffffffffffffe0->file_def >> 0x10
                                    );
                        dat[lVar6 + -4] =
                             (uchar)((uint)*(undefined4 *)&stack0xffffffffffffffe0->file_def >> 8);
                        dat[lVar6 + -3] = (uchar)*(undefined4 *)&stack0xffffffffffffffe0->file_def;
                        local_c8 = 4;
                      }
                      else {
                        *pbVar5 = (byte)((int)*(undefined4 *)&stack0xffffffffffffffe0->file_def >>
                                        0x1c) | 0xf0;
                        dat[lVar6 + -5] =
                             (uchar)(*(int *)&stack0xffffffffffffffe0->file_def >> 0x14);
                        dat[lVar6 + -4] = (uchar)(*(int *)&stack0xffffffffffffffe0->file_def >> 0xc)
                        ;
                        dat[lVar6 + -3] = (uchar)(*(int *)&stack0xffffffffffffffe0->file_def >> 4);
                        dat[lVar6 + -2] =
                             (byte)*(undefined4 *)&stack0xffffffffffffffe0->file_def & 0xf;
                        local_c8 = 5;
                      }
                      local_c4 = local_c8;
                    }
                    local_c0 = local_c4;
                  }
                  local_bc = local_c0;
                }
                pbVar5 = pbVar5 + local_bc;
                if (((ulong)stack0xffffffffffffffe0->file_def & 0xffffff8000000000) == 0) {
                  *pbVar5 = (byte)*(undefined4 *)((long)&stack0xffffffffffffffe0->file_def + 4);
                  local_cc = 1;
                }
                else {
                  if (((ulong)stack0xffffffffffffffe0->file_def & 0xffffc00000000000) == 0) {
                    *pbVar5 = (byte)((uint)*(undefined4 *)
                                            ((long)&stack0xffffffffffffffe0->file_def + 4) >> 8) |
                              0x80;
                    pbVar5[1] = (byte)*(undefined4 *)((long)&stack0xffffffffffffffe0->file_def + 4);
                    local_d0 = 2;
                  }
                  else {
                    if (((ulong)stack0xffffffffffffffe0->file_def & 0xffe0000000000000) == 0) {
                      *pbVar5 = (byte)((uint)*(undefined4 *)
                                              ((long)&stack0xffffffffffffffe0->file_def + 4) >> 0x10
                                      ) | 0xc0;
                      pbVar5[1] = (byte)((uint)*(undefined4 *)
                                                ((long)&stack0xffffffffffffffe0->file_def + 4) >> 8)
                      ;
                      pbVar5[2] = (byte)*(undefined4 *)
                                         ((long)&stack0xffffffffffffffe0->file_def + 4);
                      local_d4 = 3;
                    }
                    else {
                      if (((ulong)stack0xffffffffffffffe0->file_def & 0xf000000000000000) == 0) {
                        *pbVar5 = (byte)((uint)*(undefined4 *)
                                                ((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                        0x18) | 0xe0;
                        pbVar5[1] = (byte)((uint)*(undefined4 *)
                                                  ((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                          0x10);
                        pbVar5[2] = (byte)((uint)*(undefined4 *)
                                                  ((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                          8);
                        pbVar5[3] = (byte)*(undefined4 *)
                                           ((long)&stack0xffffffffffffffe0->file_def + 4);
                        local_d8 = 4;
                      }
                      else {
                        *pbVar5 = (byte)((int)*(undefined4 *)
                                               ((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                        0x1c) | 0xf0;
                        pbVar5[1] = (byte)(*(int *)((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                          0x14);
                        pbVar5[2] = (byte)(*(int *)((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                          0xc);
                        pbVar5[3] = (byte)(*(int *)((long)&stack0xffffffffffffffe0->file_def + 4) >>
                                          4);
                        pbVar5[4] = (byte)*(undefined4 *)
                                           ((long)&stack0xffffffffffffffe0->file_def + 4) & 0xf;
                        local_d8 = 5;
                      }
                      local_d4 = local_d8;
                    }
                    local_d0 = local_d4;
                  }
                  local_cc = local_d0;
                }
                uVar2 = crc32(0,&cp,(ulong)(pbVar5 + ((long)local_cc - (long)&cp)) & 0xffffffff);
                if (stack0xffffffffffffffe0->prefix == (char *)0x0) {
                  local_e8 = "";
                }
                else {
                  local_e8 = stack0xffffffffffffffe0->prefix;
                }
                iVar1 = crc32(uVar2,local_e8,stack0xffffffffffffffe0->record_counter & 0xffffffff);
                if (iVar1 != *(int *)&stack0xffffffffffffffe0->header) {
                  fprintf(_stderr,"Block CRC32 failure\n");
                  free(stack0xffffffffffffffe0->prefix);
                  free(stack0xffffffffffffffe0);
                  return (cram_block *)0x0;
                }
              }
              *(undefined4 *)((long)&stack0xffffffffffffffe0->fp + 4) =
                   *(undefined4 *)&stack0xffffffffffffffe0->fp;
              *(undefined4 *)((long)&stack0xffffffffffffffe0->header + 4) = 0;
              *(undefined8 *)&stack0xffffffffffffffe0->err = 0;
              *(undefined4 *)&stack0xffffffffffffffe0->ctr = 7;
              fd_local = stack0xffffffffffffffe0;
            }
          }
        }
      }
    }
  }
  return (cram_block *)fd_local;
}

Assistant:

cram_block *cram_read_block(cram_fd *fd) {
    cram_block *b = malloc(sizeof(*b));
    if (!b)
	return NULL;

    //fprintf(stderr, "Block at %d\n", (int)ftell(fd->fp));

    if (-1 == (b->method      = hgetc(fd->fp))) { free(b); return NULL; }
    if (-1 == (b->content_type= hgetc(fd->fp))) { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->content_id))  { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->comp_size))   { free(b); return NULL; }
    if (-1 == itf8_decode(fd, &b->uncomp_size)) { free(b); return NULL; }

    //    fprintf(stderr, "  method %d, ctype %d, cid %d, csize %d, ucsize %d\n",
    //	    b->method, b->content_type, b->content_id, b->comp_size, b->uncomp_size);

    if (b->method == RAW) {
	b->alloc = b->uncomp_size;
	if (!(b->data = malloc(b->uncomp_size))){ free(b); return NULL; }
	if (b->uncomp_size != hread(fd->fp, b->data, b->uncomp_size)) {
	    free(b->data);
	    free(b);
	    return NULL;
	}
    } else {
	b->alloc = b->comp_size;
	if (!(b->data = malloc(b->comp_size)))  { free(b); return NULL; }
	if (b->comp_size != hread(fd->fp, b->data, b->comp_size)) {
	    free(b->data);
	    free(b);
	    return NULL;
	}
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	unsigned char dat[100], *cp = dat;;
	uint32_t crc;

	
	if (-1 == int32_decode(fd, (int32_t *)&b->crc32)) {
	    free(b);
	    return NULL;
	}

	*cp++ = b->method;
	*cp++ = b->content_type;
	cp += itf8_put(cp, b->content_id);
	cp += itf8_put(cp, b->comp_size);
	cp += itf8_put(cp, b->uncomp_size);
	crc = crc32(0L, dat, cp-dat);
	crc = crc32(crc, b->data ? b->data : (uc *)"", b->alloc);

	if (crc != b->crc32) {
	    fprintf(stderr, "Block CRC32 failure\n");
	    free(b->data);
	    free(b);
	    return NULL;
	}
    }

    b->orig_method = b->method;
    b->idx = 0;
    b->byte = 0;
    b->bit = 7; // MSB

    return b;
}